

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idlist.h
# Opt level: O1

void __thiscall
soplex::IdList<soplex::SVSetBase<double>::DLPSV>::move
          (IdList<soplex::SVSetBase<double>::DLPSV> *this,ptrdiff_t delta)

{
  DLPSV **ppDVar1;
  DLPSV *pDVar2;
  
  pDVar2 = (this->super_IsList<soplex::SVSetBase<double>::DLPSV>).the_first;
  if (pDVar2 != (DLPSV *)0x0) {
    ppDVar1 = &(this->super_IsList<soplex::SVSetBase<double>::DLPSV>).the_last;
    *ppDVar1 = (DLPSV *)((long)&((*ppDVar1)->super_SVectorBase<double>).m_elem + delta);
    pDVar2 = (DLPSV *)((long)&(pDVar2->super_SVectorBase<double>).m_elem + delta);
    (this->super_IsList<soplex::SVSetBase<double>::DLPSV>).the_first = pDVar2;
    do {
      if (pDVar2 != (this->super_IsList<soplex::SVSetBase<double>::DLPSV>).the_last) {
        pDVar2->thenext =
             (DLPSV *)((long)&(pDVar2->thenext->super_SVectorBase<double>).m_elem + delta);
      }
      if ((this->super_IsList<soplex::SVSetBase<double>::DLPSV>).the_last == pDVar2) {
        pDVar2 = (DLPSV *)0x0;
      }
      else {
        pDVar2 = pDVar2->thenext;
      }
    } while (pDVar2 != (DLPSV *)0x0);
    pDVar2 = (this->super_IsList<soplex::SVSetBase<double>::DLPSV>).the_last;
    while (pDVar2 != (DLPSV *)0x0) {
      if (pDVar2 != (this->super_IsList<soplex::SVSetBase<double>::DLPSV>).the_first) {
        pDVar2->theprev =
             (DLPSV *)((long)&(pDVar2->theprev->super_SVectorBase<double>).m_elem + delta);
      }
      if ((this->super_IsList<soplex::SVSetBase<double>::DLPSV>).the_first == pDVar2) {
        pDVar2 = (DLPSV *)0x0;
      }
      else {
        pDVar2 = pDVar2->theprev;
      }
    }
  }
  return;
}

Assistant:

void move(ptrdiff_t delta)
   {
      if(this->the_first)
      {
         T* elem;
         IsList<T>::move(delta);

         for(elem = last(); elem; elem = prev(elem))
            if(elem != first())
               elem->prev() = reinterpret_cast<T*>(
                                 reinterpret_cast<char*>(elem->prev()) + delta);
      }
   }